

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O0

void TimerAOver(FM_ST *ST)

{
  FM_ST *ST_local;
  
  if ((ST->mode & 4) != 0) {
    FM_STATUS_SET(ST,1);
  }
  ST->TAC = 0x400 - ST->TA;
  if (ST->timer_handler != (FM_TIMERHANDLER)0x0) {
    (*ST->timer_handler)(ST->param,'\0',ST->TAC * ST->timer_prescaler,ST->clock);
  }
  ST->TAC = ST->TAC << 0xc;
  return;
}

Assistant:

INLINE void TimerAOver(FM_ST *ST)
{
	/* set status (if enabled) */
	if(ST->mode & 0x04) FM_STATUS_SET(ST,0x01);
	/* clear or reload the counter */
	ST->TAC = (1024-ST->TA);
	if (ST->timer_handler) (ST->timer_handler)(ST->param,0,ST->TAC * ST->timer_prescaler,ST->clock);
	ST->TAC *= 4096;
}